

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tempseat.c
# Opt level: O1

Seat * tempseat_new(Seat *realseat)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)safemalloc(1,0x58,0);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = &tempseat_vt;
  *puVar1 = realseat;
  bufchain_init((bufchain *)(puVar1 + 1));
  puVar1[6] = 0;
  puVar1[7] = 0;
  return (Seat *)(puVar1 + 10);
}

Assistant:

Seat *tempseat_new(Seat *realseat)
{
    TempSeat *ts = snew(TempSeat);
    memset(ts, 0, sizeof(*ts));
    ts->seat.vt = &tempseat_vt;

    ts->realseat = realseat;
    bufchain_init(&ts->output);
    ts->outchunk_head = ts->outchunk_tail = NULL;

    return &ts->seat;
}